

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

StructReader * __thiscall
capnp::_::ListReader::getStructElement
          (StructReader *__return_storage_ptr__,ListReader *this,ElementCount index)

{
  StructPointerCount SVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  CapTableReader *pCVar6;
  DebugComparison<const_int_&,_int> _kjCondition;
  Fault f;
  
  _kjCondition.left = &this->nestingLimit;
  iVar2 = this->nestingLimit;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = 0 < iVar2;
  if (iVar2 < 1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int_const&,int>&,char_const(&)[76]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc5e,FAILED,"nestingLimit > 0",
               "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
               ,&_kjCondition,
               (char (*) [76])
               "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->pointers = (WirePointer *)0x0;
    __return_storage_ptr__->segment = (SegmentReader *)0x0;
    __return_storage_ptr__->capTable = (CapTableReader *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->pointers + 6) = 0;
    __return_storage_ptr__->nestingLimit = 0x7fffffff;
    kj::_::Debug::Fault::~Fault(&f);
  }
  else {
    uVar3 = this->step;
    pbVar5 = this->ptr;
    uVar4 = this->structDataSize;
    SVar1 = this->structPointerCount;
    pCVar6 = this->capTable;
    __return_storage_ptr__->segment = this->segment;
    __return_storage_ptr__->capTable = pCVar6;
    __return_storage_ptr__->data = pbVar5 + ((ulong)uVar3 * (ulong)index >> 3);
    __return_storage_ptr__->pointers =
         (WirePointer *)(pbVar5 + ((ulong)uVar3 * (ulong)index >> 3) + (uVar4 >> 3));
    __return_storage_ptr__->dataSize = uVar4;
    __return_storage_ptr__->pointerCount = SVar1;
    __return_storage_ptr__->nestingLimit = iVar2 + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

StructReader ListReader::getStructElement(ElementCount index) const {
  KJ_REQUIRE(nestingLimit > 0,
             "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
    return StructReader();
  }

  auto indexBit = upgradeBound<uint64_t>(index) * step;
  const byte* structData = ptr + indexBit / BITS_PER_BYTE;
  const WirePointer* structPointers =
      reinterpret_cast<const WirePointer*>(structData + structDataSize / BITS_PER_BYTE);

  KJ_DASSERT(indexBit % BITS_PER_BYTE == ZERO * BITS);
  return StructReader(
      segment, capTable, structData, structPointers,
      structDataSize, structPointerCount,
      nestingLimit - 1);
}